

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O0

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_one(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
         *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *cost_matrix,unsigned_long *matrix_size,int *step)

{
  reference pvVar1;
  reference pvVar2;
  undefined8 local_48;
  unsigned_long c_1;
  unsigned_long c;
  unsigned_long r;
  double min_in_row;
  int *step_local;
  unsigned_long *matrix_size_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cost_matrix_local;
  QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
  *this_local;
  
  for (c = 0; c < *matrix_size; c = c + 1) {
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](cost_matrix,c);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,0);
    r = (unsigned_long)*pvVar2;
    for (c_1 = 0; c_1 < *matrix_size; c_1 = c_1 + 1) {
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](cost_matrix,c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,c_1);
      if (*pvVar2 < (double)r) {
        pvVar1 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](cost_matrix,c);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,c_1);
        r = (unsigned_long)*pvVar2;
      }
    }
    for (local_48 = 0; local_48 < *matrix_size; local_48 = local_48 + 1) {
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](cost_matrix,c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,local_48);
      *pvVar2 = *pvVar2 - (double)r;
    }
  }
  *step = 2;
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::step_one(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    int& step)
{
  double min_in_row;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    min_in_row = cost_matrix[r][0];
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] < min_in_row)
      {
        min_in_row = cost_matrix[r][c];
      }
    }
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      cost_matrix[r][c] -= min_in_row;
    }
  }
  step = 2;
}